

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScheduledReporter.cc
# Opt level: O1

void __thiscall cppmetrics::ScheduledReporter::start(ScheduledReporter *this)

{
  unique_lock<std::mutex> lock;
  long *local_30;
  thread local_28;
  unique_lock<std::mutex> local_20;
  
  local_20._M_device = &this->m_mutex;
  local_20._M_owns = false;
  std::unique_lock<std::mutex>::lock(&local_20);
  local_20._M_owns = true;
  if (this->m_is_running == false) {
    this->m_is_running = true;
    local_28._M_id._M_thread = (id)0;
    local_30 = (long *)operator_new(0x10);
    *local_30 = (long)&PTR___State_00120c20;
    local_30[1] = (long)this;
    std::thread::_M_start_thread(&local_28,&local_30,0);
    if (local_30 != (long *)0x0) {
      (**(code **)(*local_30 + 8))();
    }
    if ((this->m_reporter_thread)._M_id._M_thread != 0) {
      std::terminate();
    }
    (this->m_reporter_thread)._M_id._M_thread = (native_handle_type)local_28._M_id._M_thread;
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_20);
  return;
}

Assistant:

void ScheduledReporter::start()
{
  std::unique_lock<std::mutex> lock(m_mutex);
  if (!m_is_running)
  {
    m_is_running = true;
    m_reporter_thread = std::thread([&]() {
      loop_while_running();
    });
  }
}